

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

uint get_input_line(char **string,uint option)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  bool bVar4;
  int local_44;
  int r;
  int l;
  int i;
  char *line;
  uint option_local;
  char **string_local;
  
  _l = vrna_read_line(_stdin);
  if (_l == (char *)0x0) {
    string_local._4_4_ = 1;
  }
  else if ((option & 0x80) == 0) {
    do {
      bVar4 = true;
      if (*_l != '*') {
        bVar4 = *_l == '\0';
      }
      if (!bVar4) goto LAB_0015184f;
      free(_l);
      _l = vrna_read_line(_stdin);
    } while (_l != (char *)0x0);
    string_local._4_4_ = 1;
  }
  else {
LAB_0015184f:
    sVar2 = strlen(_l);
    if (*_l == '@') {
      free(_l);
      string_local._4_4_ = 2;
    }
    else {
      iVar1 = (int)sVar2;
      if ((option & 0x100) == 0) {
        do {
          local_44 = iVar1;
          r = local_44 + -1;
          if (r < 0) break;
          iVar1 = r;
        } while ((_l[r] == ' ') || (iVar1 = r, _l[r] == '\t'));
        if (r < 0) {
          local_44 = 0;
        }
        _l[local_44] = '\0';
      }
      if (*_l == '>') {
        sVar2 = strlen(_l);
        pcVar3 = (char *)vrna_alloc((int)sVar2 + 1);
        *string = pcVar3;
        iVar1 = __isoc99_sscanf(_l,">%s",*string);
        if (iVar1 < 1) {
          free(_l);
          free(*string);
          *string = (char *)0x0;
          string_local._4_4_ = 1;
        }
        else {
          sVar2 = strlen(*string);
          pcVar3 = (char *)vrna_realloc(*string,(int)sVar2 + 1);
          *string = pcVar3;
          free(_l);
          string_local._4_4_ = 8;
        }
      }
      else {
        pcVar3 = strdup(_l);
        *string = pcVar3;
        free(_l);
        string_local._4_4_ = 4;
      }
    }
  }
  return string_local._4_4_;
}

Assistant:

PUBLIC unsigned int
get_input_line(char         **string,
               unsigned int option)
{
  char  *line;
  int   i, l, r;

  /*
   * read lines until informative data appears or
   * report an error if anything goes wrong
   */
  if ((line = vrna_read_line(stdin)) == NULL)
    return VRNA_INPUT_ERROR;

  if (!(option & VRNA_INPUT_NOSKIP_COMMENTS)) {
    while ((*line == '*') || (*line == '\0')) {
      free(line);
      if ((line = vrna_read_line(stdin)) == NULL)
        return VRNA_INPUT_ERROR;
    }
  }

  l = (int)strlen(line);

  /* break on '@' sign if not disabled */
  if (*line == '@') {
    free(line);
    return VRNA_INPUT_QUIT;
  }

  /* print line read if not disabled */
  /* if(!(option & VRNA_INPUT_NOPRINT)) printf("%s\n", line); */

  /* eliminate whitespaces at the end of the line read */
  if (!(option & VRNA_INPUT_NO_TRUNCATION)) {
    for (i = l - 1; i >= 0; i--) {
      if (line[i] == ' ')
        continue;
      else if (line[i] == '\t')
        continue;
      else
        break;
    }
    line[(i >= 0) ? (i + 1) : 0] = '\0';
  }

  if (*line == '>') {
    /* fasta header */
    /* alloc memory for the string */
    *string = (char *)vrna_alloc(sizeof(char) * (strlen(line) + 1));
    r       = VRNA_INPUT_FASTA_HEADER;
    i       = sscanf(line, ">%s", *string);
    if (i > 0) {
      i       = (int)strlen(*string);
      *string = (char *)vrna_realloc(*string, (i + 1) * sizeof(char));
      free(line);
      return r;
    } else {
      free(line);
      free(*string);
      *string = NULL;
      return VRNA_INPUT_ERROR;
    }
  } else {
    *string = strdup(line);
    free(line);
  }

  return VRNA_INPUT_MISC;
}